

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

char * getResult(char *func,list *tokens,list *output)

{
  char *__s;
  char *result;
  list *operators;
  list *output_local;
  list *tokens_local;
  char *func_local;
  
  operators = output;
  output_local = tokens;
  tokens_local = (list *)func;
  __s = (char *)malloc_(0x20);
  inside_def = false;
  parenthesis_warning = false;
  initList((list **)&result);
  tokenize(output_local,(char *)tokens_local);
  validateParenthesis(output_local);
  infixToPostfix(output_local,operators,(list *)result);
  getPostfixResult(operators);
  snprintf(__s,0x20,"%.15g");
  freeList((list *)result);
  func_local = __s;
  if ((inside_def & 1U) != 0) {
    free(__s);
    func_local = (char *)0x0;
  }
  return func_local;
}

Assistant:

char *getResult(const char *func, struct list *tokens, struct list *output)
{
    struct list *operators;
    char *result = malloc_(BUFFER);
    inside_def = false;
    parenthesis_warning = false;

    initList(&operators);

    tokenize(tokens, func);
    validateParenthesis(tokens);
    infixToPostfix(tokens, output, operators);
    snprintf(result, BUFFER, NUMBER_FORMAT, getPostfixResult(output));
    freeList(operators);

    if (inside_def) {
        free(result);
        return NULL;
    }

    return result;
}